

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-virt.c
# Opt level: O0

void * mem_realloc(void *p,size_t len)

{
  size_t len_local;
  void *p_local;
  
  if (len == 0) {
    p_local = (void *)0x0;
  }
  else {
    p_local = realloc(p,len);
    if (p_local == (void *)0x0) {
      quit("Out of Memory!");
    }
  }
  return p_local;
}

Assistant:

void *mem_realloc(void *p, size_t len)
{
	/* Note: standard realloc(3) frees if passed a size of 0, so this
	 * wrapper has different behavior. */
	if (!len)
		return NULL;

	p = realloc(p, len);
	if (!p)
		quit("Out of Memory!");
	return p;
}